

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# id.cpp
# Opt level: O3

int Id_applyLogic(int *v1,int *v2)

{
  int iVar1;
  int iVar2;
  
  iVar1 = *v2;
  if (0x6d73e55f >= iVar1) {
    iVar2 = *v1;
    *v1 = iVar1;
    *v2 = iVar2 + iVar1;
  }
  return (uint)(0x6d73e55f < iVar1);
}

Assistant:

int Id_applyLogic(int *v1, int *v2) {
    if (*v2 > 1836311903) { // 46th Fibonacci fits in int
        return 1;
    }

    int temp = *v1 + *v2;
    *v1 = *v2;
    *v2 = temp;
    return 0;
}